

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O0

void __thiscall Expr::~Expr(Expr *this)

{
  void *pvVar1;
  long lVar2;
  bool bVar3;
  reference ppEVar4;
  reference ppCVar5;
  DataDepElement *in_RDI;
  iterator delete_list_i_1;
  iterator delete_list_i;
  vector<CaseExpr_*,_std::allocator<CaseExpr_*>_> *in_stack_ffffffffffffff88;
  ID *in_stack_ffffffffffffff90;
  Object *this_00;
  vector<CaseExpr_*,_std::allocator<CaseExpr_*>_> *this_01;
  __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_> local_20;
  Expr **local_18;
  __normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_> local_10 [2];
  
  in_RDI->_vptr_DataDepElement = (_func_int **)&PTR__Expr_00179cb0;
  pvVar1 = *(void **)&in_RDI[7].dde_type_;
  if (pvVar1 != (void *)0x0) {
    ID::~ID(in_stack_ffffffffffffff90);
    operator_delete(pvVar1,0x78);
  }
  if (in_RDI[6]._vptr_DataDepElement != (_func_int **)0x0) {
    (**(code **)(*in_RDI[6]._vptr_DataDepElement + 8))();
  }
  if (*(long **)&in_RDI[6].dde_type_ != (long *)0x0) {
    (**(code **)(**(long **)&in_RDI[6].dde_type_ + 8))();
  }
  if (in_RDI[7]._vptr_DataDepElement != (_func_int **)0x0) {
    (**(code **)(*in_RDI[7]._vptr_DataDepElement + 8))();
  }
  lVar2._0_4_ = in_RDI[9].dde_type_;
  lVar2._4_1_ = in_RDI[9].in_traversal;
  lVar2._5_3_ = *(undefined3 *)&in_RDI[9].field_0xd;
  if (lVar2 != 0) {
    local_10[0]._M_current =
         (Expr **)std::vector<Expr_*,_std::allocator<Expr_*>_>::begin
                            ((vector<Expr_*,_std::allocator<Expr_*>_> *)in_stack_ffffffffffffff88);
    while( true ) {
      local_18 = (Expr **)std::vector<Expr_*,_std::allocator<Expr_*>_>::end
                                    ((vector<Expr_*,_std::allocator<Expr_*>_> *)
                                     in_stack_ffffffffffffff88);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>
                          *)in_stack_ffffffffffffff90,
                         (__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>
                          *)in_stack_ffffffffffffff88);
      if (!bVar3) break;
      ppEVar4 = __gnu_cxx::__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>
                ::operator*(local_10);
      if (*ppEVar4 != (Expr *)0x0) {
        (*((*ppEVar4)->super_DataDepElement)._vptr_DataDepElement[1])();
      }
      __gnu_cxx::__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>::
      operator++(local_10);
    }
  }
  this_01 = *(vector<CaseExpr_*,_std::allocator<CaseExpr_*>_> **)&in_RDI[9].dde_type_;
  if (this_01 != (vector<CaseExpr_*,_std::allocator<CaseExpr_*>_> *)0x0) {
    std::vector<Expr_*,_std::allocator<Expr_*>_>::~vector
              ((vector<Expr_*,_std::allocator<Expr_*>_> *)this_01);
    operator_delete(this_01,0x18);
  }
  in_RDI[9].dde_type_ = ATTR;
  in_RDI[9].in_traversal = false;
  *(undefined3 *)&in_RDI[9].field_0xd = 0;
  if (in_RDI[10]._vptr_DataDepElement != (_func_int **)0x0) {
    local_20._M_current =
         (CaseExpr **)
         std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::begin(in_stack_ffffffffffffff88);
    while( true ) {
      std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::end(in_stack_ffffffffffffff88);
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                          *)in_stack_ffffffffffffff90,
                         (__normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                          *)in_stack_ffffffffffffff88);
      if (!bVar3) break;
      ppCVar5 = __gnu_cxx::
                __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>
                ::operator*(&local_20);
      if (*ppCVar5 != (CaseExpr *)0x0) {
        (*((*ppCVar5)->super_DataDepElement)._vptr_DataDepElement[1])();
      }
      __gnu_cxx::
      __normal_iterator<CaseExpr_**,_std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>_>::
      operator++(&local_20);
    }
  }
  this_00 = (Object *)in_RDI[10]._vptr_DataDepElement;
  if (this_00 != (Object *)0x0) {
    std::vector<CaseExpr_*,_std::allocator<CaseExpr_*>_>::~vector(this_01);
    operator_delete(this_00,0x18);
  }
  in_RDI[10]._vptr_DataDepElement = (_func_int **)0x0;
  std::__cxx11::string::~string((string *)&in_RDI[0xc].dde_type_);
  std::__cxx11::string::~string((string *)&in_RDI[10].dde_type_);
  DataDepElement::~DataDepElement(in_RDI);
  Object::~Object(this_00);
  return;
}

Assistant:

Expr::~Expr()
	{
	delete id_;
	delete operand_[0];
	delete operand_[1];
	delete operand_[2];
	delete_list(ExprList, args_);
	delete_list(CaseExprList, cases_);
	}